

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

void icu_63::initService(void)

{
  ICULocaleService *this;
  size_t in_RSI;
  ICULocaleService *local_28;
  
  this = (ICULocaleService *)UMemory::operator_new((UMemory *)0x198,in_RSI);
  local_28 = (ICULocaleService *)0x0;
  if (this != (ICULocaleService *)0x0) {
    ICUBreakIteratorService::ICUBreakIteratorService((ICUBreakIteratorService *)this);
    local_28 = this;
  }
  gService = local_28;
  ucln_common_registerCleanup_63(UCLN_COMMON_BREAKITERATOR,breakiterator_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initService() {
    gService = new ICUCollatorService();
    ucln_i18n_registerCleanup(UCLN_I18N_COLLATOR, collator_cleanup);
}